

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall
crnlib::crn_comp::pack_alpha_endpoints
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  int *piVar1;
  uint *puVar2;
  unsigned_short *puVar3;
  uchar *puVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  vector<unsigned_int> residual_syms;
  symbol_histogram hist;
  vector<unsigned_int> remapped_endpoints;
  static_huffman_data_model residual_dm;
  vector<unsigned_int> local_158;
  uint local_13c;
  elemental_vector local_138;
  elemental_vector local_128;
  vector<unsigned_char> *local_110;
  crn_comp *local_108;
  static_huffman_data_model local_100;
  symbol_codec local_c8;
  
  uVar9 = (this->m_alpha_endpoints).m_size;
  local_128.m_p = (void *)0x0;
  local_128.m_size = 0;
  local_128.m_capacity = 0;
  local_110 = packed_data;
  if (uVar9 != 0) {
    elemental_vector::increase_capacity(&local_128,uVar9,uVar9 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_128._8_8_ & 0xffffffff) * 4 + (long)local_128.m_p),0,
           (ulong)(uVar9 - local_128.m_size) << 2);
    local_128.m_size = uVar9;
    if ((this->m_alpha_endpoints).m_size != 0) {
      puVar2 = (this->m_alpha_endpoints).m_p;
      puVar3 = remapping->m_p;
      uVar12 = 0;
      do {
        *(uint *)((long)local_128.m_p + (ulong)puVar3[uVar12] * 4) = puVar2[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar12 < (this->m_alpha_endpoints).m_size);
    }
  }
  local_138.m_p = (void *)0x0;
  local_138.m_size = 0;
  local_138.m_capacity = 0;
  elemental_vector::increase_capacity(&local_138,0x100,false,4,(object_mover)0x0,false);
  memset((void *)((local_138._8_8_ & 0xffffffff) * 4 + (long)local_138.m_p),0,
         (ulong)(0x100 - local_138.m_size) << 2);
  local_138.m_size = 0x100;
  local_158.m_p = (uint *)0x0;
  local_158.m_size = 0;
  local_158.m_capacity = 0;
  vector<unsigned_int>::reserve(&local_158,(this->m_alpha_endpoints).m_size * 6);
  if ((this->m_alpha_endpoints).m_size != 0) {
    uVar12 = 0;
    uVar9 = 0;
    uVar13 = 0;
    local_108 = this;
    do {
      uVar7 = *(uint *)((long)local_128.m_p + uVar12 * 4);
      local_13c = dxt5_block::unpack_endpoint(uVar7,0);
      uVar6 = dxt5_block::unpack_endpoint(uVar7,1);
      uVar7 = local_13c;
      bVar10 = true;
      do {
        bVar14 = bVar10;
        uVar11 = uVar7 - uVar9 & 0xff;
        piVar1 = (int *)((long)local_138.m_p + (ulong)uVar11 * 4);
        *piVar1 = *piVar1 + 1;
        if (local_158.m_capacity <= local_158.m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_158,local_158.m_size + 1,true,4,(object_mover)0x0,
                     false);
        }
        local_158.m_p[local_158.m_size] = uVar11;
        local_158.m_size = local_158.m_size + 1;
        uVar9 = uVar13;
        uVar7 = uVar6;
        bVar10 = false;
      } while (bVar14);
      uVar12 = uVar12 + 1;
      uVar9 = local_13c;
      uVar13 = uVar6;
    } while (uVar12 < (local_108->m_alpha_endpoints).m_size);
  }
  static_huffman_data_model::static_huffman_data_model(&local_100);
  symbol_codec::symbol_codec(&local_c8);
  symbol_codec::start_encoding(&local_c8,0x100000);
  iVar8 = static_huffman_data_model::init(&local_100,(EVP_PKEY_CTX *)0x1);
  if ((char)iVar8 != '\0') {
    uVar9 = symbol_codec::encode_transmit_static_huffman_data_model
                      (&local_c8,&local_100,false,(static_huffman_data_model *)0x0);
    if (uVar9 != 0) {
      if (local_158.m_size != 0) {
        uVar12 = 0;
        do {
          symbol_codec::encode(&local_c8,local_158.m_p[uVar12],&local_100);
          uVar12 = uVar12 + 1;
        } while (uVar12 < local_158.m_size);
      }
      symbol_codec::stop_encoding(&local_c8,false);
      puVar4 = local_110->m_p;
      local_110->m_p = local_c8.m_output_buf.m_p;
      uVar5._0_4_ = local_110->m_size;
      uVar5._4_4_ = local_110->m_capacity;
      local_110->m_size = local_c8.m_output_buf.m_size;
      local_110->m_capacity = local_c8.m_output_buf.m_capacity;
      bVar10 = true;
      local_c8.m_output_buf.m_p = puVar4;
      local_c8.m_output_buf._8_8_ = uVar5;
      goto LAB_00165e07;
    }
  }
  bVar10 = false;
LAB_00165e07:
  if (local_c8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_c8.m_output_syms.m_p);
  }
  if (local_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_arith_output_buf.m_p);
  }
  if (local_c8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model(&local_100);
  if (local_158.m_p != (uint *)0x0) {
    crnlib_free(local_158.m_p);
  }
  if (local_138.m_p != (void *)0x0) {
    crnlib_free(local_138.m_p);
  }
  if (local_128.m_p != (void *)0x0) {
    crnlib_free(local_128.m_p);
  }
  return bVar10;
}

Assistant:

bool crn_comp::pack_alpha_endpoints(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint> remapped_endpoints(m_alpha_endpoints.size());

        for (uint i = 0; i < m_alpha_endpoints.size(); i++)
        {
            remapped_endpoints[remapping[i]] = m_alpha_endpoints[i];
        }

        symbol_histogram hist;
        hist.resize(256);

        crnlib::vector<uint> residual_syms;
        residual_syms.reserve(m_alpha_endpoints.size() * 2 * 3);

        uint prev[2];
        utils::zero_object(prev);

        int total_residuals = 0;

        for (uint endpoint_index = 0; endpoint_index < m_alpha_endpoints.size(); endpoint_index++)
        {
            const uint endpoint = remapped_endpoints[endpoint_index];

            uint cur[2];
            cur[0] = dxt5_block::unpack_endpoint(endpoint, 0);
            cur[1] = dxt5_block::unpack_endpoint(endpoint, 1);

            for (uint j = 0; j < 2; j++)
            {
                int delta = cur[j] - prev[j];
                total_residuals += delta * delta;

                int sym = delta & 255;

                hist.inc_freq(sym);

                residual_syms.push_back(sym);
            }

            prev[0] = cur[0];
            prev[1] = cur[1];
        }

        static_huffman_data_model residual_dm;

        symbol_codec codec;
        codec.start_encoding(1024 * 1024);

        // Transmit residuals
        if (!residual_dm.init(true, hist, 15))
        {
            return false;
        }

        if (!codec.encode_transmit_static_huffman_data_model(residual_dm, false))
        {
            return false;
        }

        for (uint i = 0; i < residual_syms.size(); i++)
        {
            const uint sym = residual_syms[i];
            codec.encode(sym, residual_dm);
        }

        codec.stop_encoding(false);

        packed_data.swap(codec.get_encoding_buf());

        return true;
    }